

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswUnique.c
# Opt level: O2

void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *p)

{
  Aig_Man_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  void *pvVar8;
  long lVar9;
  uint uVar10;
  uint Entry;
  int iVar11;
  
  pVVar6 = p->vDiffPairs;
  if (pVVar6 == (Vec_Int_t *)0x0) {
    iVar11 = p->pAig->nRegs;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < iVar11 - 1U) {
      iVar5 = iVar11;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar5;
    if (iVar5 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc((long)iVar5 << 2);
    }
    pVVar6->pArray = piVar7;
    p->vDiffPairs = pVVar6;
  }
  pVVar6->nSize = 0;
  iVar11 = 0;
  do {
    pAVar1 = p->pAig;
    iVar5 = pAVar1->nRegs;
    if (iVar5 <= iVar11) {
      pVVar6 = p->vDiffPairs;
      if (pVVar6->nSize == iVar5) {
        for (iVar11 = 0; iVar11 < iVar5; iVar11 = iVar11 + 1) {
          Vec_IntEntry(pVVar6,iVar11);
          pVVar6 = p->vDiffPairs;
          iVar5 = pVVar6->nSize;
        }
        return;
      }
      __assert_fail("Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswUnique.c"
                    ,0x46,"void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *)");
    }
    pvVar8 = Vec_PtrEntry(pAVar1->vCis,pAVar1->nTruePis + iVar11);
    lVar9 = (long)*(int *)((long)pvVar8 + 0x24) * (long)p->nFrames;
    pAVar2 = p->pNodeToFrames[lVar9];
    pAVar3 = p->pNodeToFrames[lVar9 + 1];
    if (pAVar2 == pAVar3) {
      pVVar6 = p->vDiffPairs;
      Entry = 0;
    }
    else {
      Entry = 1;
      if (pAVar2 != (Aig_Obj_t *)((ulong)pAVar3 ^ 1)) {
        uVar4 = Entry;
        if (pAVar2 != (Aig_Obj_t *)0x0) {
          uVar4 = ((uint)pAVar2 ^ *(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
        }
        uVar10 = Entry;
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          uVar10 = ((uint)pAVar3 ^ *(uint *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
        }
        if (uVar4 == uVar10) {
          iVar5 = Ssw_NodesAreEquiv(p,(Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe),
                                    (Aig_Obj_t *)((ulong)pAVar3 & 0xfffffffffffffffe));
          pVVar6 = p->vDiffPairs;
          Entry = (uint)(iVar5 != 1);
          goto LAB_004f3195;
        }
      }
      pVVar6 = p->vDiffPairs;
    }
LAB_004f3195:
    Vec_IntPush(pVVar6,Entry);
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs computation of signal correspondence with constraints.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_UniqueRegisterPairInfo( Ssw_Man_t * p )
{
    Aig_Obj_t * pObjLo, * pObj0, * pObj1;
    int i, RetValue, Counter;
    if ( p->vDiffPairs == NULL )
        p->vDiffPairs = Vec_IntAlloc( Saig_ManRegNum(p->pAig) );
    Vec_IntClear( p->vDiffPairs );
    Saig_ManForEachLo( p->pAig, pObjLo, i )
    {
        pObj0 = Ssw_ObjFrame( p, pObjLo, 0 );
        pObj1 = Ssw_ObjFrame( p, pObjLo, 1 );
        if ( pObj0 == pObj1 )
            Vec_IntPush( p->vDiffPairs, 0 );
        else if ( pObj0 == Aig_Not(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
//        else
//            Vec_IntPush( p->vDiffPairs, 1 );
        else if ( Aig_ObjPhaseReal(pObj0) != Aig_ObjPhaseReal(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
        else
        {
            RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObj0), Aig_Regular(pObj1) );
            Vec_IntPush( p->vDiffPairs, RetValue!=1 );
        }
    }
    assert( Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig) );
    // count the number of ones
    Counter = 0;
    Vec_IntForEachEntry( p->vDiffPairs, RetValue, i )
        Counter += RetValue;
//    Abc_Print( 1, "The number of different register pairs = %d.\n", Counter );
}